

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
bssl::der::test::ParserTest_TagNumbersAboveThirtySupported_Test::
~ParserTest_TagNumbersAboveThirtySupported_Test
          (ParserTest_TagNumbersAboveThirtySupported_Test *this)

{
  ParserTest_TagNumbersAboveThirtySupported_Test *this_local;
  
  ~ParserTest_TagNumbersAboveThirtySupported_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ParserTest, TagNumbersAboveThirtySupported) {
  // Context-specific class, tag number 31, length 0.
  const uint8_t der[] = {0x9f, 0x1f, 0x00};
  Parser parser((Input(der)));

  CBS_ASN1_TAG tag;
  Input value;
  ASSERT_TRUE(parser.ReadTagAndValue(&tag, &value));
  EXPECT_EQ(CBS_ASN1_CONTEXT_SPECIFIC | 31u, tag);
  ASSERT_FALSE(parser.HasMore());
}